

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOperand
          (TrimCapabilitiesPass *this,Operand *operand,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  spv_operand_type_t type;
  bool bVar1;
  uint32_t uVar2;
  spv_result_t sVar3;
  size_t sVar4;
  IRContext *pIVar5;
  AssemblyGrammar *pAVar6;
  uint *puVar7;
  byte bVar8;
  spv_operand_desc_t *psStack_78;
  spv_result_t result_1;
  spv_operand_desc_t *desc_1;
  uint local_68;
  uint32_t mask;
  uint32_t i;
  spv_result_t result;
  spv_operand_desc_t *desc;
  Capability local_34;
  Instruction *local_30;
  Instruction *memory_model;
  ExtensionSet *extensions_local;
  CapabilitySet *capabilities_local;
  Operand *operand_local;
  TrimCapabilitiesPass *this_local;
  
  memory_model = (Instruction *)extensions;
  extensions_local = (ExtensionSet *)capabilities;
  capabilities_local = (CapabilitySet *)operand;
  operand_local = (Operand *)this;
  sVar4 = utils::SmallVector<unsigned_int,_2UL>::size(&operand->words);
  if ((((sVar4 == 1) &&
       (*(int *)&(capabilities_local->buckets_).
                 super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start != 0xb)) &&
      (*(int *)&(capabilities_local->buckets_).
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start != 1)) &&
     (*(int *)&(capabilities_local->buckets_).
               super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start != 3)) {
    if (*(int *)&(capabilities_local->buckets_).
                 super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start == 5) {
      pIVar5 = Pass::context(&this->super_Pass);
      local_30 = IRContext::GetMemoryModel(pIVar5);
      if ((local_30 != (Instruction *)0x0) &&
         (uVar2 = Instruction::GetSingleWordInOperand(local_30,1), uVar2 == 3)) {
        local_34 = VulkanMemoryModelDeviceScope;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&desc,
                   (EnumSet<spv::Capability> *)extensions_local,&local_34);
      }
    }
    bVar1 = spvOperandIsConcreteMask
                      (*(spv_operand_type_t *)
                        &(capabilities_local->buckets_).
                         super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      for (local_68 = 0; local_68 < 0x20; local_68 = local_68 + 1) {
        bVar8 = (byte)local_68;
        puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                           ((SmallVector<unsigned_int,_2UL> *)
                            &(capabilities_local->buckets_).
                             super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_finish,0);
        desc_1._4_4_ = 1 << (bVar8 & 0x1f) & *puVar7;
        if (desc_1._4_4_ != 0) {
          psStack_78 = (spv_operand_desc_t *)0x0;
          pIVar5 = Pass::context(&this->super_Pass);
          pAVar6 = IRContext::grammar(pIVar5);
          sVar3 = AssemblyGrammar::lookupOperand
                            (pAVar6,*(spv_operand_type_t *)
                                     &(capabilities_local->buckets_).
                                      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                                      ._M_impl.super__Vector_impl_data._M_start,desc_1._4_4_,
                             &stack0xffffffffffffff88);
          if (sVar3 == SPV_SUCCESS) {
            addSupportedCapabilitiesToSet<spv_operand_desc_t>
                      (this,psStack_78,(CapabilitySet *)extensions_local);
            addSupportedExtensionsToSet<spv_operand_desc_t>
                      (this,psStack_78,(ExtensionSet *)memory_model);
          }
        }
      }
    }
    else {
      _i = (spv_operand_desc_t *)0x0;
      pIVar5 = Pass::context(&this->super_Pass);
      pAVar6 = IRContext::grammar(pIVar5);
      type = *(spv_operand_type_t *)
              &(capabilities_local->buckets_).
               super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                         ((SmallVector<unsigned_int,_2UL> *)
                          &(capabilities_local->buckets_).
                           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                           ._M_impl.super__Vector_impl_data._M_finish,0);
      mask = AssemblyGrammar::lookupOperand(pAVar6,type,*puVar7,(spv_operand_desc *)&i);
      if (mask == SPV_SUCCESS) {
        addSupportedCapabilitiesToSet<spv_operand_desc_t>(this,_i,(CapabilitySet *)extensions_local)
        ;
        addSupportedExtensionsToSet<spv_operand_desc_t>(this,_i,(ExtensionSet *)memory_model);
      }
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirementsForOperand(
    const Operand& operand, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // No supported capability relies on a 2+-word operand.
  if (operand.words.size() != 1) {
    return;
  }

  // No supported capability relies on a literal string operand or an ID.
  if (operand.type == SPV_OPERAND_TYPE_LITERAL_STRING ||
      operand.type == SPV_OPERAND_TYPE_ID ||
      operand.type == SPV_OPERAND_TYPE_RESULT_ID) {
    return;
  }

  // If the Vulkan memory model is declared and any instruction uses Device
  // scope, the VulkanMemoryModelDeviceScope capability must be declared. This
  // rule cannot be covered by the grammar, so must be checked explicitly.
  if (operand.type == SPV_OPERAND_TYPE_SCOPE_ID) {
    const Instruction* memory_model = context()->GetMemoryModel();
    if (memory_model && memory_model->GetSingleWordInOperand(1u) ==
                            uint32_t(spv::MemoryModel::Vulkan)) {
      capabilities->insert(spv::Capability::VulkanMemoryModelDeviceScope);
    }
  }

  // case 1: Operand is a single value, can directly lookup.
  if (!spvOperandIsConcreteMask(operand.type)) {
    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type,
                                                     operand.words[0], &desc);
    if (result != SPV_SUCCESS) {
      return;
    }
    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
    return;
  }

  // case 2: operand can be a bitmask, we need to decompose the lookup.
  for (uint32_t i = 0; i < 32; i++) {
    const uint32_t mask = (1 << i) & operand.words[0];
    if (!mask) {
      continue;
    }

    const spv_operand_desc_t* desc = {};
    auto result = context()->grammar().lookupOperand(operand.type, mask, &desc);
    if (result != SPV_SUCCESS) {
      continue;
    }

    addSupportedCapabilitiesToSet(desc, capabilities);
    addSupportedExtensionsToSet(desc, extensions);
  }
}